

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O3

ChMatrix33<double> * __thiscall
chrono::fea::ChElementHexaANCF_3843::GetGreenLagrangeStrain
          (ChMatrix33<double> *__return_storage_ptr__,ChElementHexaANCF_3843 *this,double xi,
          double eta,double zeta)

{
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ChMatrix33<double> *pCVar16;
  long lVar17;
  double *pdVar18;
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  ChMatrixNMc<double,_3,_3> F;
  ChMatrix33<double> I3x3;
  ChMatrix33<double> J_0xi;
  Matrix3xN e_bar;
  MatrixNx3c Sxi_D;
  ulong auStack_830 [5];
  ChMatrix33<double> *local_808;
  undefined1 local_800 [16];
  double dStack_7f0;
  double dStack_7e8;
  double adStack_7e0 [3];
  ulong uStack_7c8;
  double local_7c0;
  MatrixNx3c *local_7b0;
  Matrix<double,_3,_3,_1,_3,_3> *local_7a8;
  undefined8 local_7a0;
  MatrixNx3c *local_788;
  SrcXprType local_780;
  undefined8 uStack_778;
  undefined8 local_770;
  undefined8 local_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 local_750;
  undefined8 local_748;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
  local_740 [16];
  undefined8 local_730;
  Matrix<double,_3,_3,_0,_3,_3> *local_728;
  Matrix<double,_3,_3,_0,_3,_3> *local_720;
  MatrixNx3c **local_718;
  Matrix<double,_3,_3,_1,_3,_3> local_700;
  Matrix3xN local_680;
  MatrixNx3c local_380;
  
  local_808 = __return_storage_ptr__;
  Calc_Sxi_D(this,&local_380,xi,eta,zeta);
  local_700.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       0.0;
  local_700.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  local_700.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       0.0;
  local_700.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  local_700.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       0.0;
  local_700.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       0.0;
  local_700.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       0.0;
  local_700.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       0.0;
  local_700.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       0.0;
  local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data.array[0]
       = 1.0;
  Eigen::internal::
  generic_product_impl<Eigen::Matrix<double,3,32,1,3,32>,Eigen::Matrix<double,32,3,0,32,3>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,3,3,1,3,3>>
            (&local_700,&this->m_ebar0,&local_380,(Scalar *)&local_680);
  local_800._0_8_ = &local_380;
  local_788 = &local_380;
  local_780.m_xpr = &local_700;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run((Matrix<double,_3,_3,_1,_3,_3> *)(local_800 + 8),&local_780,
        (assign_op<double,_double> *)&local_680);
  pdVar18 = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.
            m_data.array + 0x18;
  local_7b0 = (MatrixNx3c *)local_800._0_8_;
  local_7a0 = 3;
  auVar1 = *(undefined1 (*) [64])
            (((PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_> *)local_800._0_8_)->
            m_storage).m_data.array;
  auVar2 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_> *)local_800._0_8_)->
             m_storage).m_data.array + 8);
  auVar3 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_> *)local_800._0_8_)->
             m_storage).m_data.array + 0x10);
  auVar4 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_> *)local_800._0_8_)->
             m_storage).m_data.array + 0x18);
  auVar5 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_> *)local_800._0_8_)->
             m_storage).m_data.array + 0x20);
  auVar6 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_> *)local_800._0_8_)->
             m_storage).m_data.array + 0x40);
  auVar7 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_> *)local_800._0_8_)->
             m_storage).m_data.array + 0x28);
  auVar8 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_> *)local_800._0_8_)->
             m_storage).m_data.array + 0x48);
  auVar9 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_> *)local_800._0_8_)->
             m_storage).m_data.array + 0x30);
  auVar10 = *(undefined1 (*) [64])
             ((((PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_> *)local_800._0_8_)->
              m_storage).m_data.array + 0x50);
  auVar11 = *(undefined1 (*) [64])
             ((((PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_> *)local_800._0_8_)->
              m_storage).m_data.array + 0x38);
  auVar12 = *(undefined1 (*) [64])
             ((((PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_> *)local_800._0_8_)->
              m_storage).m_data.array + 0x58);
  lVar17 = 7;
  do {
    auVar13._8_8_ = 0;
    auVar13._0_8_ = auStack_830[lVar17];
    auVar19 = vbroadcastsd_avx512f(auVar13);
    auVar14._8_8_ = 0;
    auVar14._0_8_ = auStack_830[lVar17 + 3];
    auVar20 = vbroadcastsd_avx512f(auVar14);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = *(ulong *)(local_800 + lVar17 * 8);
    auVar21 = vbroadcastsd_avx512f(auVar15);
    lVar17 = lVar17 + 1;
    auVar22 = vmulpd_avx512f(auVar1,auVar19);
    auVar23 = vmulpd_avx512f(auVar2,auVar19);
    auVar24 = vmulpd_avx512f(auVar3,auVar19);
    auVar19 = vmulpd_avx512f(auVar4,auVar19);
    auVar22 = vfmadd231pd_avx512f(auVar22,auVar5,auVar20);
    auVar23 = vfmadd231pd_avx512f(auVar23,auVar7,auVar20);
    auVar24 = vfmadd231pd_avx512f(auVar24,auVar9,auVar20);
    auVar19 = vfmadd231pd_avx512f(auVar19,auVar11,auVar20);
    auVar20 = vfmadd231pd_avx512f(auVar22,auVar6,auVar21);
    auVar22 = vfmadd231pd_avx512f(auVar23,auVar8,auVar21);
    auVar23 = vfmadd231pd_avx512f(auVar24,auVar10,auVar21);
    auVar19 = vfmadd231pd_avx512f(auVar19,auVar12,auVar21);
    *(undefined1 (*) [64])((plain_array<double,_96,_1,_64> *)(pdVar18 + -0x18))->array = auVar20;
    *(undefined1 (*) [64])(pdVar18 + -0x10) = auVar22;
    *(undefined1 (*) [64])(pdVar18 + -8) = auVar23;
    *(undefined1 (*) [64])pdVar18 = auVar19;
    pdVar18 = pdVar18 + 0x20;
  } while (lVar17 != 10);
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array[0]
       = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data.
         array[0];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array[1]
       = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data.
         array[1];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array[2]
       = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data.
         array[2];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array[3]
       = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data.
         array[3];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array[4]
       = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data.
         array[4];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array[5]
       = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data.
         array[5];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array[6]
       = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data.
         array[6];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array[7]
       = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data.
         array[7];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array[8]
       = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data.
         array[8];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array[9]
       = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data.
         array[9];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [10] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data.
         array[10];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0xb] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data.
          array[0xb];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0xc] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data.
          array[0xc];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0xd] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data.
          array[0xd];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0xe] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data.
          array[0xe];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0xf] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data.
          array[0xf];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x10] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x10];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x11] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x11];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x12] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x12];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x13] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x13];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x14] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x14];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x15] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x15];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x16] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x16];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x17] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x17];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x18] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x18];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x19] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x19];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x1a] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x1a];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x1b] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x1b];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x1c] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x1c];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x1d] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x1d];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x1e] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x1e];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x1f] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x1f];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x20] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x20];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x21] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x21];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x22] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x22];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x23] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x23];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x24] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x24];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x25] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x25];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x26] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x26];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x27] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x27];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x28] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x28];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x29] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x29];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x2a] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x2a];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x2b] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x2b];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x2c] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x2c];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x2d] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x2d];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x2e] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x2e];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x2f] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x2f];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x30] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x30];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x31] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x31];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x32] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x32];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x33] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x33];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x34] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x34];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x35] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x35];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x36] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x36];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x37] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x37];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x38] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x38];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x39] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x39];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x3a] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x3a];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x3b] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x3b];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x3c] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x3c];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x3d] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x3d];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x3e] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x3e];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x3f] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x3f];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x40] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x40];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x41] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x41];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x42] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x42];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x43] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x43];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x44] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x44];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x45] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x45];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x46] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x46];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x47] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x47];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x48] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x48];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x49] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x49];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x4a] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x4a];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x4b] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x4b];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x4c] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x4c];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x4d] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x4d];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x4e] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x4e];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x4f] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x4f];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x50] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x50];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x51] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x51];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x52] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x52];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x53] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x53];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x54] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x54];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x55] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x55];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x56] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x56];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x57] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x57];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x58] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x58];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x59] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x59];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x5a] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x5a];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x5b] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x5b];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x5c] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x5c];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x5d] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x5d];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x5e] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x5e];
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.m_data.array
  [0x5f] = local_680.super_PlainObjectBase<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>.m_storage.m_data
           .array[0x5f];
  local_7a8 = (Matrix<double,_3,_3,_1,_3,_3> *)(local_800 + 8);
  CalcCoordMatrix(this,&local_680);
  local_7c0 = 0.0;
  local_800._0_8_ = 0.0;
  local_800._8_8_ = 0.0;
  dStack_7f0 = 0.0;
  dStack_7e8 = 0.0;
  adStack_7e0[0] = 0.0;
  adStack_7e0[1] = 0.0;
  adStack_7e0[2] = 0.0;
  uStack_7c8 = 0;
  local_788 = (MatrixNx3c *)0x3ff0000000000000;
  Eigen::internal::
  generic_product_impl<Eigen::Matrix<double,3,32,1,3,32>,Eigen::Matrix<double,32,3,0,32,3>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,3,3,0,3,3>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)local_800,&local_680,&local_380,(Scalar *)&local_788);
  pCVar16 = local_808;
  local_788 = (MatrixNx3c *)0x3ff0000000000000;
  local_770 = 0;
  local_780.m_xpr = (XprTypeNested)0x0;
  uStack_778 = 0;
  local_768 = 0x3ff0000000000000;
  local_750 = 0;
  local_760 = 0;
  uStack_758 = 0;
  local_748 = 0x3ff0000000000000;
  local_730 = 0x3fe0000000000000;
  local_728 = (Matrix<double,_3,_3,_0,_3,_3> *)local_800;
  local_720 = (Matrix<double,_3,_3,_0,_3,_3> *)local_800;
  local_718 = &local_788;
  ChMatrix33<double>::
  ChMatrix33<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Matrix<double,3,3,1,3,3>const>const>>
            (local_808,local_740);
  return pCVar16;
}

Assistant:

ChMatrix33<> ChElementHexaANCF_3843::GetGreenLagrangeStrain(const double xi, const double eta, const double zeta) {
    MatrixNx3c Sxi_D;  // Matrix of normalized shape function derivatives
    Calc_Sxi_D(Sxi_D, xi, eta, zeta);

    ChMatrix33<double> J_0xi;  // Element Jacobian between the reference configuration and normalized configuration
    J_0xi.noalias() = m_ebar0 * Sxi_D;

    Sxi_D = Sxi_D * J_0xi.inverse();  // Adjust the shape function derivative matrix to account for the potentially
                                      // distorted reference configuration

    Matrix3xN e_bar;  // Element coordinates in matrix form
    CalcCoordMatrix(e_bar);

    // Calculate the Deformation Gradient at the current point
    ChMatrixNMc<double, 3, 3> F = e_bar * Sxi_D;

    ChMatrix33<> I3x3;
    I3x3.setIdentity();
    return 0.5 * (F.transpose() * F - I3x3);
}